

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

bool Grammar::is_integer_value(string *str)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  if (str->_M_string_length == 0) {
    return false;
  }
  bVar2 = str_utils::is_numeric(*(str->_M_dataplus)._M_p);
  if (((bVar2) || (cVar1 = *(str->_M_dataplus)._M_p, cVar1 == '-')) || (cVar1 == '+')) {
    if (1 < (int)str->_M_string_length) {
      lVar4 = 1;
      do {
        bVar2 = str_utils::is_numeric((str->_M_dataplus)._M_p[lVar4]);
        if (!bVar2) goto LAB_0013fa2b;
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)str->_M_string_length);
    }
    bVar3 = str_utils::is_numeric(*(str->_M_dataplus)._M_p);
    bVar2 = true;
    if (!bVar3) {
      bVar2 = 1 < str->_M_string_length;
    }
  }
  else {
LAB_0013fa2b:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Grammar::is_integer_value(const std::string& str) {
    if (str.size() == 0)
        return false;
    if (!str_utils::is_numeric(str[0]) && str[0] != '+' && str[0] != '-')
        return false;
    for (int i = 1; i < int(str.size()); i++)
        if (!str_utils::is_numeric(str[i]))
            return false;
    return str_utils::is_numeric(str[0]) || str.size() > 1;
}